

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O3

int big_block_mpi_grow(BigBlock *bb,int Nfile_grow,size_t *fsize_grow,MPI_Comm comm)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  FILE *__stream;
  MPI_Comm extraout_RDX;
  MPI_Comm extraout_RDX_00;
  MPI_Comm comm_00;
  ulong uVar3;
  long lVar4;
  int rank;
  int NTask;
  undefined8 local_38;
  
  if (comm == (MPI_Comm)&ompi_mpi_comm_null) {
    iVar2 = 0;
  }
  else {
    local_38 = in_RAX;
    MPI_Comm_size(comm,(long)&local_38 + 4);
    MPI_Comm_rank(comm,&local_38);
    iVar1 = bb->Nfile;
    iVar2 = 0;
    if ((int)local_38 == 0) {
      iVar2 = _big_block_grow_internal(bb,Nfile_grow,fsize_grow);
    }
    iVar2 = big_file_mpi_broadcast_anyerror(iVar2,comm);
    if (iVar2 == 0) {
      comm_00 = extraout_RDX;
      if ((int)local_38 != 0) {
        _big_block_close_internal(bb);
        comm_00 = extraout_RDX_00;
      }
      big_block_mpi_broadcast(bb,(int)comm,comm_00);
      lVar4 = (long)Nfile_grow;
      iVar2 = 0;
      uVar3 = (ulong)(int)((ulong)((int)local_38 * lVar4) / (ulong)(long)local_38._4_4_);
      if (uVar3 < (ulong)(((long)(int)local_38 + 1) * lVar4) / (ulong)(long)local_38._4_4_) {
        do {
          __stream = (FILE *)_big_file_open_a_file(bb->basename,iVar1 + (int)uVar3,"w",1);
          if (__stream == (FILE *)0x0) {
            iVar2 = -1;
            break;
          }
          fclose(__stream);
          uVar3 = uVar3 + 1;
          iVar2 = 0;
        } while (uVar3 < (ulong)(((long)(int)local_38 + 1) * lVar4) / (ulong)(long)local_38._4_4_);
      }
      iVar2 = big_file_mpi_broadcast_anyerror(iVar2,comm);
    }
  }
  return iVar2;
}

Assistant:

int
big_block_mpi_grow(BigBlock * bb,
    int Nfile_grow,
    const size_t fsize_grow[],
    MPI_Comm comm) {

    int rank;
    int NTask;
    int rt;

    if(comm == MPI_COMM_NULL) return 0;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &rank);

    int oldNfile = bb->Nfile;

    if(rank == 0) {
        rt = _big_block_grow_internal(bb, Nfile_grow, fsize_grow);
    } else {
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    if(rank != 0) {
        /* closed on non-root because we will bcast.*/
        _big_block_close_internal(bb);
    }
    big_block_mpi_broadcast(bb, 0, comm);

    int i;
    for(i = (size_t) Nfile_grow * rank / NTask; i < (size_t) Nfile_grow * (rank + 1) / NTask; i ++) {
        FILE * fp = _big_file_open_a_file(bb->basename, i + oldNfile, "w", 1);
        if(fp == NULL) {
            rt = -1;
            break;
        }
        fclose(fp);
    }

    BCAST_AND_RAISEIF(rt, comm);

    return rt;
}